

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::IRContext::ReplaceAllUsesWithPredicate
          (IRContext *this,uint32_t before,uint32_t after,
          function<bool_(spvtools::opt::Instruction_*)> *predicate)

{
  pointer pOVar1;
  Analysis AVar2;
  uint32_t uVar3;
  uint uVar4;
  Instruction *pIVar5;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  char *message;
  undefined8 *puVar12;
  vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
  uses_to_update;
  _Any_data local_90;
  PodType aPStack_80 [2];
  code **local_78;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_70;
  uint32_t local_64;
  Instruction *local_60;
  undefined8 *local_58;
  undefined8 *puStack_50;
  long local_48;
  undefined8 *local_38;
  ulong uVar6;
  
  if (before != after) {
    AVar2 = this->valid_analyses_;
    if ((AVar2 >> 0x10 & 1) != 0) {
      analysis::DebugInfoManager::ReplaceAllUsesInDebugScopeWithPredicate
                ((this->debug_info_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>.
                 _M_head_impl,before,after,predicate);
      AVar2 = this->valid_analyses_;
    }
    if ((AVar2 & kAnalysisBegin) == kAnalysisNone) {
      BuildDefUseManager(this);
    }
    pIVar5 = analysis::DefUseManager::GetDef
                       ((this->def_use_mgr_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                        _M_head_impl,after);
    if (pIVar5 == (Instruction *)0x0) {
      __assert_fail("get_def_use_mgr()->GetDef(after) && \"\'after\' is not a registered def.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_context.cpp"
                    ,0x148,
                    "bool spvtools::opt::IRContext::ReplaceAllUsesWithPredicate(uint32_t, uint32_t, const std::function<bool (Instruction *)> &)"
                   );
    }
    local_58 = (undefined8 *)0x0;
    puStack_50 = (undefined8 *)0x0;
    local_48 = 0;
    if ((this->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      BuildDefUseManager(this);
    }
    local_90._8_8_ = &local_58;
    local_78 = (code **)std::
                        _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_context.cpp:332:15)>
                        ::_M_invoke;
    aPStack_80 = (PodType  [2])
                 std::
                 _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_context.cpp:332:15)>
                 ::_M_manager;
    local_90._M_unused._M_object = predicate;
    analysis::DefUseManager::ForEachUse
              ((this->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               before,(function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)&local_90);
    if (aPStack_80 != (PodType  [2])0x0) {
      (*(code *)aPStack_80)(&local_90,&local_90,3);
    }
    local_38 = puStack_50;
    if (local_58 != puStack_50) {
      local_60 = (Instruction *)0x0;
      puVar12 = local_58;
      local_64 = before;
      do {
        pIVar5 = (Instruction *)*puVar12;
        uVar4 = *(uint *)(puVar12 + 1);
        if (local_60 == (Instruction *)0x0 || local_60 != pIVar5) {
          ForgetUses(this,pIVar5);
          local_60 = pIVar5;
        }
        uVar9 = 0;
        uVar10 = 0;
        if (pIVar5->has_result_id_ == true) {
          uVar3 = Instruction::GetSingleWordOperand(pIVar5,(uint)pIVar5->has_type_id_);
          uVar10 = (uint)(uVar3 != 0);
        }
        if (pIVar5->has_type_id_ == true) {
          uVar3 = Instruction::GetSingleWordOperand(pIVar5,0);
          uVar9 = (uint)(uVar3 != 0);
        }
        if (uVar4 < uVar9 + uVar10) {
          bVar7 = pIVar5->has_type_id_;
          if ((bool)bVar7 != true) {
LAB_005ce920:
            if (((bVar7 & 1) == 0) ||
               (uVar3 = Instruction::GetSingleWordOperand(pIVar5,0), uVar3 == 0)) {
              local_90._M_unused._M_member_pointer = 0x165;
              message = 
              "assertion failed: Result type id considered as use while the instruction doesn\'t have a result type id."
              ;
            }
            else {
              local_90._M_unused._M_member_pointer = 0x169;
              message = "assertion failed: Trying setting the immutable result id.";
            }
            aPStack_80[0].data._M_elems = (array<signed_char,_4UL>)0x0;
            aPStack_80[1].data._M_elems = (array<signed_char,_4UL>)0x0;
            local_90._8_8_ = 0;
            Log(&this->consumer_,SPV_MSG_INTERNAL_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_context.cpp"
                ,(spv_position_t *)&local_90,message);
            exit(1);
          }
          uVar3 = Instruction::GetSingleWordOperand(pIVar5,0);
          bVar7 = pIVar5->has_type_id_;
          if ((uVar3 == 0) || (uVar4 != 0)) goto LAB_005ce920;
          if ((bVar7 & 1) == 0) {
            __assert_fail("has_type_id_",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                          ,0x2de,"void spvtools::opt::Instruction::SetResultType(uint32_t)");
          }
          if (after == 0) {
            __assert_fail("ty_id != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                          ,0x2e3,"void spvtools::opt::Instruction::SetResultType(uint32_t)");
          }
          local_90._M_unused._M_object = &PTR__SmallVector_00930a20;
          local_78 = (code **)aPStack_80;
          local_70._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          aPStack_80[0].data._M_elems = (array<signed_char,_4UL>)(array<signed_char,_4UL>)after;
          local_90._8_8_ = (undefined8 **)0x1;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    (&((pIVar5->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start)->words,
                     (SmallVector<unsigned_int,_2UL> *)&local_90);
        }
        else {
          local_90._M_unused._M_object = &PTR__SmallVector_00930a20;
          local_78 = (code **)aPStack_80;
          local_70._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          aPStack_80[0].data._M_elems = (array<signed_char,_4UL>)(array<signed_char,_4UL>)after;
          local_90._8_8_ = (undefined8 **)0x1;
          uVar8 = (pIVar5->has_result_id_ & 1) + 1;
          if (pIVar5->has_type_id_ == false) {
            uVar8 = (uint)pIVar5->has_result_id_;
          }
          uVar4 = (uVar4 - (uVar9 + uVar10)) + uVar8;
          uVar6 = (ulong)uVar4;
          pOVar1 = (pIVar5->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar11 = ((long)(pIVar5->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar1 >> 4) *
                   -0x5555555555555555;
          if (uVar11 < uVar6 || uVar11 - uVar6 == 0) {
            __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                          ,0x2b8,
                          "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                         );
          }
          if (uVar4 < uVar8) {
            __assert_fail("index >= TypeResultIdCount() && \"operand is not a in-operand\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                          ,0x2b9,
                          "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                         );
          }
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    (&pOVar1[uVar6].words,(SmallVector<unsigned_int,_2UL> *)&local_90);
        }
        local_90._M_unused._M_object = &PTR__SmallVector_00930a20;
        if (local_70._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_70,local_70._M_head_impl);
        }
        AnalyzeUses(this,pIVar5);
        puVar12 = puVar12 + 2;
        before = local_64;
      } while (puVar12 != local_38);
    }
    if (local_58 != (undefined8 *)0x0) {
      operator_delete(local_58,local_48 - (long)local_58);
    }
  }
  return before != after;
}

Assistant:

bool IRContext::ReplaceAllUsesWithPredicate(
    uint32_t before, uint32_t after,
    const std::function<bool(Instruction*)>& predicate) {
  if (before == after) return false;

  if (AreAnalysesValid(kAnalysisDebugInfo)) {
    get_debug_info_mgr()->ReplaceAllUsesInDebugScopeWithPredicate(before, after,
                                                                  predicate);
  }

  // Ensure that |after| has been registered as def.
  assert(get_def_use_mgr()->GetDef(after) &&
         "'after' is not a registered def.");

  std::vector<std::pair<Instruction*, uint32_t>> uses_to_update;
  get_def_use_mgr()->ForEachUse(
      before, [&predicate, &uses_to_update](Instruction* user, uint32_t index) {
        if (predicate(user)) {
          uses_to_update.emplace_back(user, index);
        }
      });

  Instruction* prev = nullptr;
  for (auto p : uses_to_update) {
    Instruction* user = p.first;
    uint32_t index = p.second;
    if (prev == nullptr || prev != user) {
      ForgetUses(user);
      prev = user;
    }
    const uint32_t type_result_id_count =
        (user->result_id() != 0) + (user->type_id() != 0);

    if (index < type_result_id_count) {
      // Update the type_id. Note that result id is immutable so it should
      // never be updated.
      if (user->type_id() != 0 && index == 0) {
        user->SetResultType(after);
      } else if (user->type_id() == 0) {
        SPIRV_ASSERT(consumer_, false,
                     "Result type id considered as use while the instruction "
                     "doesn't have a result type id.");
        (void)consumer_;  // Makes the compiler happy for release build.
      } else {
        SPIRV_ASSERT(consumer_, false,
                     "Trying setting the immutable result id.");
      }
    } else {
      // Update an in-operand.
      uint32_t in_operand_pos = index - type_result_id_count;
      // Make the modification in the instruction.
      user->SetInOperand(in_operand_pos, {after});
    }
    AnalyzeUses(user);
  }
  return true;
}